

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ExpressionFilter::Copy(ExpressionFilter *this)

{
  pointer pEVar1;
  ExpressionFilter *this_00;
  long in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_18;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 0x10));
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_20,pEVar1);
  this_00 = (ExpressionFilter *)operator_new(0x18);
  local_18._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Expression *)0x0;
  ExpressionFilter(this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ExpressionFilter::Copy() const {
	return make_uniq<ExpressionFilter>(expr->Copy());
}